

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O3

void __thiscall leveldb::AddBoundaryInputsTest::~AddBoundaryInputsTest(AddBoundaryInputsTest *this)

{
  FileMetaData *pFVar1;
  pointer pcVar2;
  pointer ppFVar3;
  pointer ppFVar4;
  ulong uVar5;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__AddBoundaryInputsTest_00165878;
  ppFVar3 = (this->all_files_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar4 = (this->all_files_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar4 != ppFVar3) {
    uVar5 = 0;
    do {
      pFVar1 = ppFVar3[uVar5];
      if (pFVar1 != (FileMetaData *)0x0) {
        pcVar2 = (pFVar1->largest).rep_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(pFVar1->largest).rep_.field_2) {
          operator_delete(pcVar2);
        }
        pcVar2 = (pFVar1->smallest).rep_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(pFVar1->smallest).rep_.field_2) {
          operator_delete(pcVar2);
        }
      }
      operator_delete(pFVar1);
      uVar5 = uVar5 + 1;
      ppFVar3 = (this->all_files_).
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppFVar4 = (this->all_files_).
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar5 < (ulong)((long)ppFVar4 - (long)ppFVar3 >> 3));
  }
  if (ppFVar4 != ppFVar3) {
    (this->all_files_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar3;
  }
  Comparator::~Comparator(&(this->icmp_).super_Comparator);
  ppFVar3 = (this->all_files_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar3 != (pointer)0x0) {
    operator_delete(ppFVar3);
  }
  ppFVar3 = (this->compaction_files_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar3 != (pointer)0x0) {
    operator_delete(ppFVar3);
  }
  ppFVar3 = (this->level_files_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar3 != (pointer)0x0) {
    operator_delete(ppFVar3);
  }
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

~AddBoundaryInputsTest() {
    for (size_t i = 0; i < all_files_.size(); ++i) {
      delete all_files_[i];
    }
    all_files_.clear();
  }